

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O3

void Cba_NtkCollectDistrib(Cba_Ntk_t *p,int *pCounts,int *pUserCounts)

{
  byte bVar1;
  uint uVar2;
  long lVar3;
  int *piVar4;
  ulong uVar5;
  long lVar6;
  
  uVar2 = (p->vObjType).nSize;
  uVar5 = (ulong)uVar2;
  if (1 < (int)uVar2) {
    lVar6 = 1;
    do {
      if ((int)uVar5 <= lVar6) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      bVar1 = (p->vObjType).pArray[lVar6];
      if (0xffffffa8 < bVar1 - 0x5a) {
        if (bVar1 == 3) {
          if ((p->vObjFunc).nSize < 1) {
            lVar3 = 0;
          }
          else {
            Vec_IntFillExtra(&p->vObjFunc,(int)lVar6 + 1,0);
            if ((p->vObjFunc).nSize <= lVar6) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                            ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            lVar3 = (long)(p->vObjFunc).pArray[lVar6];
          }
          piVar4 = pUserCounts + lVar3;
        }
        else {
          piVar4 = pCounts + bVar1;
        }
        *piVar4 = *piVar4 + 1;
      }
      lVar6 = lVar6 + 1;
      uVar5 = (ulong)(p->vObjType).nSize;
    } while (lVar6 < (long)uVar5);
  }
  return;
}

Assistant:

void Cba_NtkCollectDistrib( Cba_Ntk_t * p, int * pCounts, int * pUserCounts )
{
    int i;
    Cba_NtkForEachBox( p, i )
        if ( Cba_ObjIsBoxUser(p, i) )
            pUserCounts[Cba_ObjNtkId(p, i)]++;
        else
            pCounts[Cba_ObjType(p, i)]++;
}